

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

spv_result_t
anon_unknown.dwarf_1f7c3c::encodeImmediate
          (AssemblyContext *context,char *text,spv_instruction_t *pInst)

{
  bool bVar1;
  size_t sVar2;
  DiagnosticStream *pDVar3;
  spv_result_t sVar4;
  uint32_t parse_result;
  uint32_t local_204;
  char *local_200;
  DiagnosticStream local_1f8;
  
  if (*text == '!') {
    bVar1 = spvtools::utils::ParseNumber<unsigned_int>(text + 1,&local_204);
    if (bVar1) {
      spvtools::AssemblyContext::binaryEncodeU32(context,local_204,pInst);
      sVar2 = strlen(text);
      spvtools::AssemblyContext::seekForward(context,(uint32_t)sVar2);
      sVar4 = SPV_SUCCESS;
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_1f8,context,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Invalid immediate integer: !",0x1c);
      local_200 = text + 1;
      pDVar3 = spvtools::DiagnosticStream::operator<<(&local_1f8,&local_200);
      sVar4 = pDVar3->error_;
      spvtools::DiagnosticStream::~DiagnosticStream(&local_1f8);
    }
    return sVar4;
  }
  __assert_fail("*text == \'!\'",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                ,0xa4,
                "spv_result_t (anonymous namespace)::encodeImmediate(spvtools::AssemblyContext *, const char *, spv_instruction_t *)"
               );
}

Assistant:

spv_result_t encodeImmediate(spvtools::AssemblyContext* context,
                             const char* text, spv_instruction_t* pInst) {
  assert(*text == '!');
  uint32_t parse_result;
  if (!spvtools::utils::ParseNumber(text + 1, &parse_result)) {
    return context->diagnostic(SPV_ERROR_INVALID_TEXT)
           << "Invalid immediate integer: !" << text + 1;
  }
  context->binaryEncodeU32(parse_result, pInst);
  context->seekForward(static_cast<uint32_t>(strlen(text)));
  return SPV_SUCCESS;
}